

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.cpp
# Opt level: O0

optional<int> __thiscall rtb::Concurrency::Queue<int>::pop(Queue<int> *this)

{
  _Optional_payload_base<int> _Var1;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  reference poVar5;
  key_type local_60;
  _List_node_base *local_58;
  key_type local_50;
  key_type local_48 [3];
  key_type local_30;
  undefined1 local_28 [8];
  unique_lock<std::mutex> mlock;
  Queue<int> *this_local;
  optional<int> val;
  
  mlock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex_);
  while( true ) {
    local_30._M_thread = (native_handle_type)std::this_thread::get_id();
    pmVar3 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&this->subscribersMissingRead_,&local_30);
    if (*pmVar3 != 0) break;
    std::condition_variable::wait((unique_lock *)&this->cond_);
  }
  local_48[0]._M_thread = (native_handle_type)std::this_thread::get_id();
  pmVar4 = std::
           map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
           ::operator[](&this->subscribersNextRead_,local_48);
  poVar5 = std::_List_iterator<std::optional<int>_>::operator*(pmVar4);
  _Var1 = (poVar5->super__Optional_base<int,_true,_true>)._M_payload.
          super__Optional_payload_base<int>;
  local_50._M_thread = (native_handle_type)std::this_thread::get_id();
  pmVar4 = std::
           map<std::thread::id,_std::_List_iterator<std::optional<int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
           ::operator[](&this->subscribersNextRead_,&local_50);
  local_58 = (_List_node_base *)std::_List_iterator<std::optional<int>_>::operator++(pmVar4,0);
  local_60._M_thread = (native_handle_type)std::this_thread::get_id();
  pmVar3 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&this->subscribersMissingRead_,&local_60);
  *pmVar3 = *pmVar3 + -1;
  bVar2 = someoneSlowerThanMe(this);
  if (!bVar2) {
    std::__cxx11::list<std::optional<int>,_std::allocator<std::optional<int>_>_>::pop_front
              (&this->queue_);
  }
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_28);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return (optional<int>)_Var1;
}

Assistant:

std::optional<T> Queue<T>::pop() {
        std::unique_lock<std::mutex> mlock(mutex_);
        while (subscribersMissingRead_[std::this_thread::get_id()] == 0) {
            cond_.wait(mlock);
        }
        auto val{ *subscribersNextRead_[std::this_thread::get_id()] };
        // advance iterator (maybe goes to .end())
        subscribersNextRead_[std::this_thread::get_id()]++;
        subscribersMissingRead_[std::this_thread::get_id()]--;

        if (!someoneSlowerThanMe()) { queue_.pop_front(); }

        mlock.unlock();
        return val;
    }